

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.cpp
# Opt level: O2

Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
yaml::ParserContext::readAnyValue_abi_cxx11_
          (Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,ParserContext *this)

{
  bool bVar1;
  int iVar2;
  YamlEvent *pYVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  Mapping *mapping;
  vector<yaml::Value,_std::allocator<yaml::Value>_> *pvVar5;
  size_type *psVar6;
  int iVar7;
  _Alloc_hider _Var8;
  allocator<char> local_139;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_138;
  YamlEvent event;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result;
  YamlEvent event_1;
  bool local_a8;
  Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  event_result_1;
  _Rb_tree_node_base local_70;
  size_t local_50;
  pointer local_48;
  pointer pVStack_40;
  pointer local_38;
  
  iVar7 = 0;
  local_138 = __return_storage_ptr__;
  do {
    _Var8._M_p = (pointer)((long)&event_result.field_0 + 0x10);
    psVar6 = &event_1.value._M_string_length;
    if (iVar7 == 2) {
      getNextEvent_abi_cxx11_(&event_result,this);
      if (event_result.has_value_ == false) {
        pbVar4 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error(&event_result);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&event_1
                       ,"Error while reading mapping: ",pbVar4);
        event_result_1.field_0.error_.error_._M_dataplus._M_p =
             (_Alloc_hider)((long)&event_result_1.field_0 + 0x10);
        if ((size_type *)event_1._0_8_ == psVar6) {
          event_result_1.field_0._24_8_ = event_1.value.field_2._M_allocated_capacity;
        }
        else {
          event_result_1.field_0.error_.error_._M_dataplus._M_p =
               (_Alloc_hider)(_Alloc_hider)event_1._0_8_;
        }
        event_result_1.field_0.value_.value._M_string_length = event_1.value._M_string_length;
        pYVar3 = &event_1;
        event_result_1.field_0.value_.value._M_dataplus._M_p =
             (_Alloc_hider)(_Alloc_hider)event_1.value._M_dataplus._M_p;
        event_1.value._M_dataplus._M_p = (pointer)0x0;
        event_1.value._M_string_length = event_1.value._M_string_length & 0xffffffffffffff00;
        event_1._0_8_ = psVar6;
        Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(local_138,(UnexpectedType *)&event_result_1);
        std::__cxx11::string::~string((string *)&event_result_1);
      }
      else {
        pYVar3 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::value(&event_result);
        YamlEvent::YamlEvent(&event,pYVar3);
        if (event.type == YAML_SCALAR_EVENT) {
          Value::Value((Value *)&event_result_1,&event.value);
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(local_138,(Value *)&event_result_1);
          Value::~Value((Value *)&event_result_1);
        }
        else if (event.type == YAML_SEQUENCE_START_EVENT) {
          readSequence_abi_cxx11_
                    ((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&event_1,this);
          if (event_1.value.field_2._M_local_buf[8] == '\0') {
            pbVar4 = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&event_1);
            std::__cxx11::string::string((string *)&event_result_1,(string *)pbVar4);
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(local_138,(UnexpectedType *)&event_result_1);
            std::__cxx11::string::~string((string *)&event_result_1);
          }
          else {
            pvVar5 = Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::value((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&event_1);
            event_result_1.field_0.error_.error_._M_string_length =
                 (long)&event_result_1.field_0 + 0x18;
            event_result_1.field_0.value_.type = 2;
            event_result_1.field_0.value_.value._M_string_length = 0;
            event_result_1.field_0._24_8_ = event_result_1.field_0._24_8_ & 0xffffffffffffff00;
            local_70._M_left = &local_70;
            local_70._M_color = _S_red;
            local_70._M_parent = (_Base_ptr)0x0;
            local_50 = 0;
            local_48 = (pvVar5->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            pVStack_40 = (pvVar5->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
            local_38 = (pvVar5->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>).
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
            (pvVar5->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (pvVar5->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            (pvVar5->super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_70._M_right = local_70._M_left;
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(local_138,(Value *)&event_result_1);
            Value::~Value((Value *)&event_result_1);
          }
          Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&event_1);
        }
        else if (event.type == YAML_MAPPING_START_EVENT) {
          readMapping_abi_cxx11_
                    ((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&event_1,this);
          if (local_a8 == false) {
            pbVar4 = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::error((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&event_1);
            std::__cxx11::string::string((string *)&event_result_1,(string *)pbVar4);
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(local_138,(UnexpectedType *)&event_result_1);
            std::__cxx11::string::~string((string *)&event_result_1);
          }
          else {
            mapping = Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::value((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)&event_1);
            Value::Value((Value *)&event_result_1,mapping);
            Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Expected(local_138,(Value *)&event_result_1);
            Value::~Value((Value *)&event_result_1);
          }
          Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~Expected((Expected<yaml::Mapping,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&event_1);
        }
        else {
          format_abi_cxx11_((string *)&event_1,"Unexpected event %d");
          event_result_1.field_0.error_.error_._M_dataplus._M_p =
               (_Alloc_hider)((long)&event_result_1.field_0 + 0x10);
          if ((size_type *)event_1._0_8_ == psVar6) {
            event_result_1.field_0._24_8_ = event_1.value.field_2._M_allocated_capacity;
          }
          else {
            event_result_1.field_0.error_.error_._M_dataplus._M_p =
                 (_Alloc_hider)(_Alloc_hider)event_1._0_8_;
          }
          event_result_1.field_0.value_.value._M_string_length = event_1.value._M_string_length;
          event_result_1.field_0.value_.value._M_dataplus._M_p =
               (_Alloc_hider)(_Alloc_hider)event_1.value._M_dataplus._M_p;
          event_1.value._M_dataplus._M_p = (pointer)0x0;
          event_1.value._M_string_length = event_1.value._M_string_length & 0xffffffffffffff00;
          event_1._0_8_ = psVar6;
          Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Expected(local_138,(UnexpectedType *)&event_result_1);
          std::__cxx11::string::~string((string *)&event_result_1);
          std::__cxx11::string::~string((string *)&event_1);
        }
        pYVar3 = (YamlEvent *)&event.value;
      }
      std::__cxx11::string::~string((string *)pYVar3);
      Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&event_result);
      return local_138;
    }
    getNextEvent_abi_cxx11_(&event_result_1,this);
    if (event_result_1.has_value_ == false) {
      pbVar4 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::error(&event_result_1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &event_result,"Error while reading mapping: ",pbVar4);
      if (event_result.field_0.error_.error_._M_dataplus._M_p == (_Alloc_hider)_Var8._M_p) {
        event_1.value.field_2._M_allocated_capacity = event_result.field_0._24_8_;
        event_1._0_8_ = psVar6;
      }
      else {
        event_1._0_8_ = event_result.field_0.error_.error_._M_dataplus._M_p;
      }
      event_1.value._M_string_length = event_result.field_0.value_.value._M_string_length;
      event_1.value._M_dataplus._M_p = (pointer)event_result.field_0.value_.value._M_dataplus._M_p;
      event_result.field_0.error_.error_._M_string_length = 0;
      event_result.field_0.value_.value._M_string_length =
           event_result.field_0.value_.value._M_string_length & 0xffffffffffffff00;
      event_result.field_0.error_.error_._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
      Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(local_138,(UnexpectedType *)&event_1);
      std::__cxx11::string::~string((string *)&event_1);
      std::__cxx11::string::~string((string *)&event_result);
      bVar1 = false;
    }
    else {
      pYVar3 = Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&event_result_1);
      YamlEvent::YamlEvent(&event_1,pYVar3);
      if (event_1.type == YAML_STREAM_START_EVENT) {
        if (iVar7 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&event,"Unexpected YAML_STREAM_START_EVENT",&local_139);
          goto LAB_0013a958;
        }
        bVar1 = true;
        iVar2 = 1;
      }
      else {
        if (event_1.type == YAML_DOCUMENT_START_EVENT) {
          bVar1 = true;
          iVar2 = 2;
          if (iVar7 == 1) goto LAB_0013a9e2;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&event,"Unexpected YAML_DOCUMENT_START_EVENT",&local_139);
          event_result.field_0.error_.error_._M_dataplus._M_p =
               (_Alloc_hider)((long)&event_result.field_0 + 0x10);
          if ((size_type *)event._0_8_ == &event.value._M_string_length) {
            event_result.field_0._24_8_ = event.value.field_2._M_allocated_capacity;
          }
          else {
            event_result.field_0.error_.error_._M_dataplus._M_p =
                 (_Alloc_hider)(_Alloc_hider)event._0_8_;
          }
          event_result.field_0.value_.value._M_string_length._1_7_ =
               event.value._M_string_length._1_7_;
          event_result.field_0.value_.value._M_string_length._0_1_ =
               (undefined1)event.value._M_string_length;
          event_result.field_0.value_.value._M_dataplus._M_p =
               (_Alloc_hider)(_Alloc_hider)event.value._M_dataplus._M_p;
        }
        else {
          format_abi_cxx11_((string *)&event,"Unexpected event %d");
LAB_0013a958:
          if ((size_type *)event._0_8_ == &event.value._M_string_length) {
            event_result.field_0._24_8_ = event.value.field_2._M_allocated_capacity;
            event_result.field_0.error_.error_._M_dataplus._M_p = (_Alloc_hider)_Var8._M_p;
          }
          else {
            event_result.field_0.error_.error_._M_dataplus._M_p =
                 (_Alloc_hider)(_Alloc_hider)event._0_8_;
          }
          event_result.field_0.value_.value._M_string_length._1_7_ =
               event.value._M_string_length._1_7_;
          event_result.field_0.value_.value._M_string_length._0_1_ =
               (undefined1)event.value._M_string_length;
          event_result.field_0.value_.value._M_dataplus._M_p =
               (_Alloc_hider)(_Alloc_hider)event.value._M_dataplus._M_p;
        }
        event._0_8_ = &event.value._M_string_length;
        event.value._M_dataplus._M_p = (pointer)0x0;
        event.value._M_string_length._0_1_ = 0;
        Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(local_138,(UnexpectedType *)&event_result);
        std::__cxx11::string::~string((string *)&event_result);
        std::__cxx11::string::~string((string *)&event);
        bVar1 = false;
        iVar2 = iVar7;
      }
LAB_0013a9e2:
      iVar7 = iVar2;
      std::__cxx11::string::~string((string *)&event_1.value);
    }
    Expected<yaml::ParserContext::YamlEvent,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&event_result_1);
    if (!bVar1) {
      return local_138;
    }
  } while( true );
}

Assistant:

Expected<Value, std::string> readAnyValue() {
		enum class State {
			Init,
			StreamStarted,
			DocumentStarted,
		};

		for(State state = State::Init; state != State::DocumentStarted;) {
			auto event_result = getNextEvent();
			if (!event_result)
				return Unexpected("Error while reading mapping: " + event_result.error());
			YamlEvent event = std::move(event_result).value();

			switch (event.type) {
				case YAML_STREAM_START_EVENT:
					if (state != State::Init)
						return Unexpected<std::string>("Unexpected YAML_STREAM_START_EVENT");
					state = State::StreamStarted;
					break;
				case YAML_DOCUMENT_START_EVENT:
					if (state != State::StreamStarted)
						return Unexpected<std::string>("Unexpected YAML_DOCUMENT_START_EVENT");
					state = State::DocumentStarted;
					break;
				default:
					return Unexpected(format("Unexpected event %d", event.type));
			} // switch (event.type)
		} // for(state != DocumentStarted)

		auto event_result = getNextEvent();
		if (!event_result)
			return Unexpected("Error while reading mapping: " + event_result.error());
		YamlEvent event = std::move(event_result).value();

		switch (event.type) {
			case YAML_SCALAR_EVENT:
				MSG("YAML_SCALAR_EVENT: value=%s", event.value.c_str());
				return Value(std::move(event.value));
			case YAML_SEQUENCE_START_EVENT:
				MSG("YAML_SEQUENCE_START_EVENT");
				{
					auto result = readSequence();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			case YAML_MAPPING_START_EVENT:
				MSG("YAML_MAPPING_START_EVENT");
				{
					auto result = readMapping();
					if (!result)
						return Unexpected(result.error());
					return Value(std::move(result).value());
				}
			default:
				return Unexpected(format("Unexpected event %d", event.type));
		}
	}